

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::GetNamedRuntimeDependencySet(cmGlobalGenerator *this,string *name)

{
  iterator __x;
  bool bVar1;
  pointer ppVar2;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_cmInstallRuntimeDependencySet_*>_>::value,_pair<iterator,_bool>_>
  _Var3;
  pointer local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>
  local_68;
  _Base_ptr local_40;
  undefined1 local_38;
  undefined1 local_30 [8];
  __single_object set;
  undefined1 local_20 [8];
  iterator it;
  string *name_local;
  cmGlobalGenerator *this_local;
  
  it._M_node = (_Base_ptr)name;
  local_20 = (undefined1  [8])
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>_>
             ::find(&this->RuntimeDependencySetsByName,name);
  set._M_t.
  super___uniq_ptr_impl<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet_*,_std::default_delete<cmInstallRuntimeDependencySet>_>
  .super__Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>,_true,_true>
        )std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>_>
         ::end(&this->RuntimeDependencySetsByName);
  bVar1 = std::operator==((_Self *)local_20,(_Self *)&set);
  if (bVar1) {
    std::make_unique<cmInstallRuntimeDependencySet,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    __x = it;
    local_70 = std::
               unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
               ::get((unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                      *)local_30);
    std::make_pair<std::__cxx11::string_const&,cmInstallRuntimeDependencySet*>
              (&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x._M_node,
               &local_70);
    _Var3 = std::
            map<std::__cxx11::string,cmInstallRuntimeDependencySet*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
            ::insert<std::pair<std::__cxx11::string,cmInstallRuntimeDependencySet*>>
                      ((map<std::__cxx11::string,cmInstallRuntimeDependencySet*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
                        *)&this->RuntimeDependencySetsByName,&local_68);
    local_40 = (_Base_ptr)_Var3.first._M_node;
    local_38 = _Var3.second;
    local_20 = (undefined1  [8])local_40;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>
    ::~pair(&local_68);
    std::
    vector<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>_>_>
    ::push_back(&this->RuntimeDependencySets,(value_type *)local_30);
    std::
    unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>::
    ~unique_ptr((unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                 *)local_30);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>
                         *)local_20);
  return ppVar2->second;
}

Assistant:

cmInstallRuntimeDependencySet* cmGlobalGenerator::GetNamedRuntimeDependencySet(
  const std::string& name)
{
  auto it = this->RuntimeDependencySetsByName.find(name);
  if (it == this->RuntimeDependencySetsByName.end()) {
    auto set = cm::make_unique<cmInstallRuntimeDependencySet>(name);
    it =
      this->RuntimeDependencySetsByName.insert(std::make_pair(name, set.get()))
        .first;
    this->RuntimeDependencySets.push_back(std::move(set));
  }
  return it->second;
}